

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall
ghc::filesystem::path::operator+=(path *this,basic_string_view<char,_std::char_traits<char>_> x)

{
  string_view *source;
  impl_string_type local_40;
  string_view local_20;
  
  local_20._M_str = x._M_str;
  local_20._M_len = x._M_len;
  source = &local_20;
  path<std::basic_string_view<char,std::char_traits<char>>,ghc::filesystem::path>
            ((path *)&local_40,source,auto_format);
  postprocess_path_with_format(&local_40,(format)source);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(std::basic_string_view<value_type> x)
{
    return concat(x);
}